

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

MDOperand * __thiscall
LLVMBC::ModuleParseContext::get_metadata(ModuleParseContext *this,uint64_t index)

{
  const_iterator cVar1;
  MDOperand *pMVar2;
  uint64_t local_10;
  
  local_10 = index;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->metadata)._M_h,&local_10);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pMVar2 = LLVMContext::construct<LLVMBC::MDOperand,LLVMBC::Module*const&>
                       (this->context,&this->module);
  }
  else {
    pMVar2 = *(MDOperand **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_LLVMBC::MDOperand_*>,_false>
                     ._M_cur + 0x10);
  }
  return pMVar2;
}

Assistant:

MDOperand *ModuleParseContext::get_metadata(uint64_t index) const
{
	auto itr = metadata.find(index);
	if (itr != metadata.end())
		return itr->second;
	else
	{
		// Need to return a null-node like this since MDOperand is used as a reference in the LLVM API for some reason.
		return context->construct<MDOperand>(module);
	}
}